

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int agginfoPersistExprCb(Walker *pWalker,Expr *pExpr)

{
  AggInfo *pAVar1;
  Parse *pParse;
  int iVar2;
  Expr *pEVar3;
  void *pvVar4;
  
  if (((pExpr->flags & 0x14000) == 0) && (pAVar1 = pExpr->pAggInfo, pAVar1 != (AggInfo *)0x0)) {
    iVar2 = (int)pExpr->iAgg;
    pParse = pWalker->pParse;
    if (pExpr->op == 0xa9) {
      if (((iVar2 < pAVar1->nFunc) && (pAVar1->aFunc[iVar2].pFExpr == pExpr)) &&
         ((pEVar3 = exprDup(pParse->db,pExpr,0,(EdupBuf *)0x0), pEVar3 != (Expr *)0x0 &&
          (pvVar4 = sqlite3ParserAddCleanup(pParse,sqlite3ExprDeleteGeneric,pEVar3),
          pvVar4 != (void *)0x0)))) {
        pAVar1->aFunc[iVar2].pFExpr = pEVar3;
      }
    }
    else if ((((iVar2 < pAVar1->nColumn) && (pAVar1->aCol[iVar2].pCExpr == pExpr)) &&
             (pEVar3 = exprDup(pParse->db,pExpr,0,(EdupBuf *)0x0), pEVar3 != (Expr *)0x0)) &&
            (pvVar4 = sqlite3ParserAddCleanup(pParse,sqlite3ExprDeleteGeneric,pEVar3),
            pvVar4 != (void *)0x0)) {
      pAVar1->aCol[iVar2].pCExpr = pEVar3;
    }
  }
  return 0;
}

Assistant:

static int agginfoPersistExprCb(Walker *pWalker, Expr *pExpr){
  if( ALWAYS(!ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced))
   && pExpr->pAggInfo!=0
  ){
    AggInfo *pAggInfo = pExpr->pAggInfo;
    int iAgg = pExpr->iAgg;
    Parse *pParse = pWalker->pParse;
    sqlite3 *db = pParse->db;
    assert( iAgg>=0 );
    if( pExpr->op!=TK_AGG_FUNCTION ){
      if( iAgg<pAggInfo->nColumn
       && pAggInfo->aCol[iAgg].pCExpr==pExpr
      ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr && !sqlite3ExprDeferredDelete(pParse, pExpr) ){
          pAggInfo->aCol[iAgg].pCExpr = pExpr;
        }
      }
    }else{
      assert( pExpr->op==TK_AGG_FUNCTION );
      if( ALWAYS(iAgg<pAggInfo->nFunc)
       && pAggInfo->aFunc[iAgg].pFExpr==pExpr
      ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr && !sqlite3ExprDeferredDelete(pParse, pExpr) ){
          pAggInfo->aFunc[iAgg].pFExpr = pExpr;
        }
      }
    }
  }
  return WRC_Continue;
}